

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_8x16(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  INT32 z1;
  INT32 tmp17;
  INT32 tmp16;
  INT32 tmp15;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp7;
  INT32 tmp6;
  INT32 tmp5;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_1c4;
  int *local_1b8;
  int *local_1b0;
  int local_1a8 [8];
  int local_188 [8];
  int local_168 [8];
  int local_148 [8];
  int local_128 [8];
  int local_108 [8];
  int local_e8 [8];
  int local_c8 [10];
  long local_a0;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  long local_60;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  uint local_14;
  long local_10;
  int *local_8;
  
  local_1c4 = 0;
  local_1b0 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    while( true ) {
      pbVar1 = (byte *)(*(long *)(local_10 + (long)local_1c4 * 8) + (ulong)local_14);
      local_60._0_4_ = (uint)*pbVar1 + (uint)pbVar1[7] + (uint)pbVar1[3] + (uint)pbVar1[4];
      wsptr = (DCTELEM *)
              ((long)(int)((uint)*pbVar1 + (uint)pbVar1[7]) -
              (long)(int)((uint)pbVar1[3] + (uint)pbVar1[4]));
      dataptr._0_4_ = (uint)pbVar1[1] + (uint)pbVar1[6] + (uint)pbVar1[2] + (uint)pbVar1[5];
      elemptr = (JSAMPROW)
                ((long)(int)((uint)pbVar1[1] + (uint)pbVar1[6]) -
                (long)(int)((uint)pbVar1[2] + (uint)pbVar1[5]));
      local_20 = (long)(int)((uint)*pbVar1 - (uint)pbVar1[7]);
      local_28 = (long)(int)((uint)pbVar1[1] - (uint)pbVar1[6]);
      local_30 = (long)(int)((uint)pbVar1[2] - (uint)pbVar1[5]);
      local_38 = (long)(int)((uint)pbVar1[3] - (uint)pbVar1[4]);
      *local_1b0 = ((int)local_60 + (int)dataptr + -0x400) * 4;
      local_1b0[4] = ((int)local_60 - (int)dataptr) * 4;
      local_a0 = (long)((long)wsptr + (long)elemptr) * 0x1151;
      local_1b0[2] = (int)(local_a0 + (long)wsptr * 0x187e + 0x400 >> 0xb);
      local_1b0[6] = (int)(local_a0 + (long)elemptr * -0x3b21 + 0x400 >> 0xb);
      local_60 = local_20 + local_38;
      lVar2 = local_28 + local_30;
      lVar3 = local_20 + local_30;
      lVar4 = local_28 + local_38;
      lVar5 = (lVar3 + lVar4) * 0x25a1;
      local_28 = local_28 * 0x6254;
      local_30 = local_30 * 0x41b3;
      local_38 = local_38 * 0x98e;
      local_60 = local_60 * -0x1ccd;
      dataptr = (DCTELEM *)(lVar2 * -0x5203);
      wsptr = (DCTELEM *)(lVar5 + lVar3 * -0xc7c);
      elemptr = (JSAMPROW)(lVar5 + lVar4 * -0x3ec5);
      local_1b0[1] = (int)((long)wsptr + local_20 * 0x300b + local_60 + 0x400 >> 0xb);
      local_1b0[3] = (int)((long)(elemptr + (long)dataptr + local_28 + 0x400) >> 0xb);
      local_1b0[5] = (int)((long)wsptr + (long)dataptr + local_30 + 0x400 >> 0xb);
      local_1b0[7] = (int)((long)(elemptr + local_38 + local_60 + 0x400) >> 0xb);
      local_1c4 = local_1c4 + 1;
      if (local_1c4 != 8) break;
      local_1b0 = local_1a8;
    }
    if (local_1c4 == 0x10) break;
    local_1b0 = local_1b0 + 8;
  }
  local_1b0 = local_8;
  local_1b8 = local_1a8;
  for (local_1c4 = 7; -1 < local_1c4; local_1c4 = local_1c4 + -1) {
    lVar2 = (long)(*local_1b0 + local_1b8[0x38]) + (long)(local_1b0[0x38] + *local_1b8);
    lVar3 = (long)(*local_1b0 + local_1b8[0x38]) - (long)(local_1b0[0x38] + *local_1b8);
    lVar4 = (long)(local_1b0[8] + local_1b8[0x30]) + (long)(local_1b0[0x30] + local_1b8[8]);
    lVar5 = (long)(local_1b0[8] + local_1b8[0x30]) - (long)(local_1b0[0x30] + local_1b8[8]);
    lVar6 = (long)(local_1b0[0x10] + local_1b8[0x28]) + (long)(local_1b0[0x28] + local_1b8[0x10]);
    lVar7 = (long)(local_1b0[0x10] + local_1b8[0x28]) - (long)(local_1b0[0x28] + local_1b8[0x10]);
    lVar8 = (long)(local_1b0[0x18] + local_1b8[0x20]) + (long)(local_1b0[0x20] + local_1b8[0x18]);
    lVar9 = (long)(local_1b0[0x18] + local_1b8[0x20]) - (long)(local_1b0[0x20] + local_1b8[0x18]);
    lVar10 = (long)(*local_1b0 - local_1b8[0x38]);
    lVar11 = (long)(local_1b0[8] - local_1b8[0x30]);
    lVar12 = (long)(local_1b0[0x10] - local_1b8[0x28]);
    lVar13 = (long)(local_1b0[0x18] - local_1b8[0x20]);
    lVar14 = (long)(local_1b0[0x20] - local_1b8[0x18]);
    lVar15 = (long)(local_1b0[0x28] - local_1b8[0x10]);
    lVar16 = (long)(local_1b0[0x30] - local_1b8[8]);
    lVar17 = (long)(local_1b0[0x38] - *local_1b8);
    *local_1b0 = (int)(lVar2 + lVar4 + lVar6 + lVar8 + 4 >> 3);
    local_1b0[0x20] =
         (int)((ulong)((lVar2 - lVar8) * 0x29cf + (lVar4 - lVar6) * 0x1151 + 0x8000) >> 0x10);
    lVar2 = (lVar9 - lVar5) * 0x8d4 + (lVar3 - lVar7) * 0x2c63;
    local_1b0[0x10] = (int)((ulong)(lVar2 + lVar5 * 0x2e75 + lVar7 * 0x4587 + 0x8000) >> 0x10);
    local_1b0[0x30] = (int)((ulong)(lVar2 + lVar3 * -0x6c2 + lVar9 * -0x21f9 + 0x8000) >> 0x10);
    lVar2 = (lVar10 + lVar11) * 0x2b4e + (lVar16 - lVar17) * 0xd23;
    lVar3 = (lVar10 + lVar12) * 0x27e9 + (lVar15 + lVar17) * 0x1555;
    lVar4 = (lVar10 + lVar13) * 0x22fc + (lVar14 - lVar17) * 0x1cb6;
    lVar5 = (lVar11 + lVar12) * 0x470 + (lVar16 - lVar15) * 0x2d09;
    lVar6 = (lVar11 + lVar13) * -0x1555 + (lVar14 + lVar16) * -0x27e9;
    lVar7 = (lVar12 + lVar13) * -0x2b4e + (lVar15 - lVar14) * 0xd23;
    local_1b0[8] = (int)((ulong)(lVar2 + lVar3 + lVar4 + lVar10 * -0x492a + lVar17 * 0x18f3 + 0x8000
                                ) >> 0x10);
    local_1b0[0x18] =
         (int)((ulong)(lVar5 + lVar6 + lVar11 * 0x24d + lVar16 * -0x353f + lVar2 + 0x8000) >> 0x10);
    local_1b0[0x28] =
         (int)((ulong)(lVar5 + lVar7 + lVar12 * -0x2406 + lVar15 * 0x2747 + lVar3 + 0x8000) >> 0x10)
    ;
    local_1b0[0x38] =
         (int)((ulong)(lVar6 + lVar7 + lVar13 * 0x2218 + lVar14 * 0x4560 + lVar4 + 0x8000) >> 0x10);
    local_1b0 = local_1b0 + 1;
    local_1b8 = local_1b8 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_8x16 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16, tmp17;
  INT32 z1;
  DCTELEM workspace[DCTSIZE2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp10 + tmp11 - 8 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM) ((tmp10 - tmp11) << PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[2] = (DCTELEM) DESCALE(z1 + MULTIPLY(tmp12, FIX_0_765366865),
				   CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 - MULTIPLY(tmp13, FIX_1_847759065),
				   CONST_BITS-PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[1] = (DCTELEM) DESCALE(tmp0 + tmp10 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1 + tmp11 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2 + tmp11 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp3 + tmp10 + tmp13, CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == DCTSIZE * 2)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by 8/16 = 1/2.
   * 16-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/32).
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] + wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] + wsptr[DCTSIZE*0];

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] - wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] - wsptr[DCTSIZE*0];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(tmp10 + tmp11 + tmp12 + tmp13, PASS1_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS+PASS1_BITS+1);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+c10 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS+PASS1_BITS+1);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+PASS1_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}